

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O3

bool __thiscall Js::AsmJsModuleCompiler::CompileAllFunctions(AsmJsModuleCompiler *this)

{
  int iVar1;
  bool bVar2;
  Type *ppAVar3;
  int funcIndex;
  int funcIndex_00;
  int iVar4;
  AsmJsFunc *func;
  int j;
  int iVar5;
  
  iVar1 = (this->mFunctionArray).
          super_ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>.count;
  bVar2 = true;
  if (0 < iVar1) {
    iVar5 = 0;
    ppAVar3 = JsUtil::
              List<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(&this->mFunctionArray,0);
    func = *ppAVar3;
    bVar2 = CompileFunction(this,func,funcIndex);
    if (bVar2) {
      iVar4 = 1;
      do {
        iVar5 = iVar4;
        func->field_0xd3 = func->field_0xd3 | 1;
        if (iVar1 == iVar5) {
          return true;
        }
        iVar4 = iVar5 + 1;
        ppAVar3 = JsUtil::
                  List<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(&this->mFunctionArray,iVar5);
        func = *ppAVar3;
        bVar2 = CompileFunction(this,func,funcIndex_00);
      } while (bVar2);
      bVar2 = iVar1 <= iVar5;
      iVar5 = 0;
    }
    else {
      iVar4 = 1;
      bVar2 = false;
    }
    do {
      RevertFunction(this,iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar4 != iVar5);
  }
  return bVar2;
}

Assistant:

bool AsmJsModuleCompiler::CompileAllFunctions()
    {
        const int size = mFunctionArray.Count();

        for (int i = 0; i < size; i++)
        {
            AsmJsFunc* func = mFunctionArray.Item(i);

            if (!CompileFunction(func, i))
            {
                // an error occurred in the function, revert state on all asm.js functions
                for (int j = 0; j <= i; j++)
                {
                    RevertFunction(j);
                }
                return false;
            }
            func->Finish();
        }
        return true;
    }